

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void prune_partitions_after_none
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,
               PICK_MODE_CONTEXT *ctx_none,PartitionSearchState *part_search_state,
               RD_STATS *best_rdc,uint *pb_source_variance)

{
  bool bVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  int *piVar5;
  long in_RCX;
  PartitionSearchState *in_RSI;
  long in_RDI;
  long in_R8;
  int *in_R9;
  RD_STATS *unaff_retaddr;
  MACROBLOCK *in_stack_00000008;
  int rate_breakout_thr;
  int64_t dist_breakout_thr;
  int use_ml_based_breakout;
  BLOCK_SIZE bsize;
  RD_STATS *this_rdc;
  PartitionBlkParams blk_params;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  PartitionBlkParams local_6c;
  RD_STATS *local_40;
  AV1_COMMON *local_38;
  int *local_30;
  long local_28;
  long local_20;
  
  local_38 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_40 = &in_RSI[1].this_rdc;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  memcpy(&local_6c,(void *)(in_R8 + 8),0x2c);
  lVar2 = local_28;
  piVar5 = (int *)(local_28 + 0x58);
  iVar4 = frame_is_intra_only(local_38);
  if ((iVar4 == 0) &&
     ((((*(int *)(local_28 + 300) != 0 || (*(int *)(local_28 + 0x128) != 0)) &&
       (in_RSI[0x21].partition_rect_allowed
        [(ulong)((byte)*(undefined2 *)(**(long **)((long)(local_40 + 0xc4) + 0x18) + 0xa7) & 7) - 1]
        == 0)) && (*(int *)(local_20 + 0x1a4) != 0)))) {
    bVar1 = false;
    if ((local_6c.bsize <= *(BLOCK_SIZE *)(in_RDI + 0x60968)) &&
       (bVar1 = false, local_6c.bsize != BLOCK_4X4)) {
      bVar1 = 0 < *(int *)(in_RDI + 0x609c8);
    }
    if (bVar1) {
      av1_ml_predict_breakout
                ((AV1_COMP *)dist_breakout_thr,in_stack_00000008,unaff_retaddr,
                 (uint)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RSI);
    }
    if ((*(long *)(local_30 + 2) <
         *(long *)(in_RDI + 0x60970) >> (10 - (""[local_6c.bsize] + ""[local_6c.bsize]) & 0x3f)) &&
       (*local_30 <
        (int)(*(int *)(in_RDI + 0x60978) *
             (uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_6c.bsize]))) {
      *(undefined4 *)(local_28 + 300) = 0;
      *(undefined4 *)(local_28 + 0x128) = 0;
    }
  }
  if ((((((*(int *)(in_RDI + 0x6099c) != 0) && (local_38->show_frame != 0)) &&
        (iVar4 = frame_is_intra_only(local_38), iVar4 == 0)) &&
       (((BLOCK_16X8 < local_6c.bsize && (_Var3 = av1_blk_has_rows_and_cols(&local_6c), _Var3)) &&
        ((*(long *)(lVar2 + 0x68) < 0x7fffffffffffffff &&
         ((-1 < *(long *)(lVar2 + 0x68) && (*piVar5 < 0x7fffffff)))))))) && (-1 < *piVar5)) &&
     ((*(int *)(local_28 + 300) != 0 || (*(int *)(local_28 + 0x128) != 0)))) {
    av1_simple_motion_search_early_term_none
              ((AV1_COMP *)blk_params._36_8_,(MACROBLOCK *)blk_params._28_8_,
               (SIMPLE_MOTION_DATA_TREE *)blk_params._20_8_,(RD_STATS *)blk_params._12_8_,
               (PartitionSearchState *)blk_params._4_8_);
  }
  return;
}

Assistant:

static void prune_partitions_after_none(AV1_COMP *const cpi, MACROBLOCK *x,
                                        SIMPLE_MOTION_DATA_TREE *sms_tree,
                                        PICK_MODE_CONTEXT *ctx_none,
                                        PartitionSearchState *part_search_state,
                                        RD_STATS *best_rdc,
                                        unsigned int *pb_source_variance) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  const PartitionBlkParams blk_params = part_search_state->part_blk_params;
  RD_STATS *this_rdc = &part_search_state->this_rdc;
  const BLOCK_SIZE bsize = blk_params.bsize;
  assert(bsize < BLOCK_SIZES_ALL);

  if (!frame_is_intra_only(cm) &&
      (part_search_state->do_square_split ||
       part_search_state->do_rectangular_split) &&
      !x->e_mbd.lossless[xd->mi[0]->segment_id] && ctx_none->skippable) {
    const int use_ml_based_breakout =
        bsize <= cpi->sf.part_sf.use_square_partition_only_threshold &&
        bsize > BLOCK_4X4 && cpi->sf.part_sf.ml_predict_breakout_level >= 1;
    if (use_ml_based_breakout) {
      av1_ml_predict_breakout(cpi, x, this_rdc, *pb_source_variance, xd->bd,
                              part_search_state);
    }

    // Adjust dist breakout threshold according to the partition size.
    const int64_t dist_breakout_thr =
        cpi->sf.part_sf.partition_search_breakout_dist_thr >>
        ((2 * (MAX_SB_SIZE_LOG2 - 2)) -
         (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]));
    const int rate_breakout_thr =
        cpi->sf.part_sf.partition_search_breakout_rate_thr *
        num_pels_log2_lookup[bsize];
    // If all y, u, v transform blocks in this partition are skippable,
    // and the dist & rate are within the thresholds, the partition
    // search is terminated for current branch of the partition search
    // tree. The dist & rate thresholds are set to 0 at speed 0 to
    // disable the early termination at that speed.
    if (best_rdc->dist < dist_breakout_thr &&
        best_rdc->rate < rate_breakout_thr) {
      part_search_state->do_square_split = 0;
      part_search_state->do_rectangular_split = 0;
    }
  }

  // Early termination: using simple_motion_search features and the
  // rate, distortion, and rdcost of PARTITION_NONE, a DNN will make a
  // decision on early terminating at PARTITION_NONE.
  if (cpi->sf.part_sf.simple_motion_search_early_term_none && cm->show_frame &&
      !frame_is_intra_only(cm) && bsize >= BLOCK_16X16 &&
      av1_blk_has_rows_and_cols(&blk_params) && this_rdc->rdcost < INT64_MAX &&
      this_rdc->rdcost >= 0 && this_rdc->rate < INT_MAX &&
      this_rdc->rate >= 0 &&
      (part_search_state->do_square_split ||
       part_search_state->do_rectangular_split)) {
    av1_simple_motion_search_early_term_none(cpi, x, sms_tree, this_rdc,
                                             part_search_state);
  }
}